

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratedMessageReflection *this,Message *message,
          FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  FieldOptions *this_01;
  ArenaStringPtr *this_02;
  string *psVar5;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetString",CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    psVar5 = FieldDescriptor::default_value_string_abi_cxx11_(field);
    psVar5 = ExtensionSet::GetString(this_00,number,psVar5);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
  }
  else {
    this_01 = FieldDescriptor::options(field);
    FieldOptions::ctype(this_01);
    this_02 = GetField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
    psVar5 = ArenaStringPtr::Get_abi_cxx11_(this_02);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

string GeneratedMessageReflection::GetString(
    const Message& message, const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        return GetField<ArenaStringPtr>(message, field).Get();
      }
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return GetEmptyString();  // Make compiler happy.
  }
}